

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-c.cpp
# Opt level: O0

duckdb_interval duckdb_value_interval(duckdb_result *result,idx_t col,idx_t row)

{
  idx_t in_RDX;
  duckdb_result *in_RSI;
  interval_t iVar1;
  duckdb_interval dVar2;
  interval_t ival;
  duckdb_interval result_value;
  undefined8 local_38;
  int64_t iVar3;
  
  iVar1 = duckdb::GetInternalCValue<duckdb::interval_t,duckdb::TryCast>(in_RSI,in_RDX,local_38);
  dVar2.months = iVar1.months;
  dVar2.days = iVar1.days;
  register0x00000010 = iVar1.micros;
  return dVar2;
}

Assistant:

duckdb_interval duckdb_value_interval(duckdb_result *result, idx_t col, idx_t row) {
	duckdb_interval result_value;
	auto ival = GetInternalCValue<interval_t>(result, col, row);
	result_value.months = ival.months;
	result_value.days = ival.days;
	result_value.micros = ival.micros;
	return result_value;
}